

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

bool __thiscall
gnuplotio::
PairOfRange<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_float>_>
::is_end(PairOfRange<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_float>_>
         *this)

{
  bool bVar1;
  length_error *this_00;
  
  bVar1 = PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
          ::is_end(&this->l);
  if (bVar1 == ((this->r).it._M_current == (this->r).end._M_current)) {
    return bVar1;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"columns were different lengths");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

bool is_end() const {
        bool el = l.is_end();
        bool er = r.is_end();
        if(el != er) {
            throw std::length_error("columns were different lengths");
        }
        return el;
    }